

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O1

bool tcu::compareThreshold(RGBA a,RGBA b,RGBA threshold)

{
  bool bVar1;
  RGBA local_4;
  
  bVar1 = true;
  if (a.m_value != b.m_value) {
    bVar1 = RGBA::isBelowThreshold(&local_4,threshold);
  }
  return bVar1;
}

Assistant:

inline bool compareThreshold (RGBA a, RGBA b, RGBA threshold)
{
	if (a == b) return true;	// Quick-accept
	return computeAbsDiff(a, b).isBelowThreshold(threshold);
}